

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

uint32_t arm::register_num(Reg r)

{
  Reg r_local;
  undefined4 local_4;
  
  local_4 = r;
  if (0xf < r) {
    if (r < 0x30) {
      local_4 = r - 0x10;
    }
    else if (r < 0x40) {
      local_4 = r - 0x30;
    }
    else if (r < 0x80000000) {
      local_4 = r - 0x40;
    }
    else if (r < 0xc0000000) {
      local_4 = r + 0x80000000;
    }
    else {
      local_4 = r + 0x40000000;
    }
  }
  return local_4;
}

Assistant:

uint32_t register_num(Reg r) {
  if (r < 16)
    return r;
  else if (r < 48)
    return r - 16;
  else if (r < 64)
    return r - 48;
  else if (r < 1 << 31)
    return r - 64;
  else if (r < 3 << 30)
    return r - (1 << 31);
  else
    return r - (3 << 30);
}